

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O3

string * __thiscall
t_st_generator::a_type_abi_cxx11_(string *__return_storage_ptr__,t_st_generator *this,t_type *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  long lVar4;
  _Alloc_hider _Var5;
  int iVar6;
  long *plVar7;
  char *pcVar8;
  size_type *psVar9;
  string prefix;
  string local_90;
  string local_70;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = (char *)0x0;
  local_40[0] = 0;
  type_name_abi_cxx11_(&local_70,this,type);
  paVar1 = &local_70.field_2;
  iVar6 = tolower((int)*local_70._M_dataplus._M_p);
  uVar3 = iVar6 - 0x61U >> 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pcVar8 = "a";
  if (((byte)(0x495 >> ((byte)uVar3 & 0x1f)) &
      (uVar3 | (uint)((iVar6 - 0x61U & 1) != 0) << 0x1f) < 0xb) != 0) {
    pcVar8 = "an";
  }
  std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,(ulong)pcVar8);
  type_name_abi_cxx11_(&local_90,this,type);
  _Var5._M_p = local_90._M_dataplus._M_p;
  paVar2 = &local_90.field_2;
  iVar6 = toupper((int)*local_90._M_dataplus._M_p);
  *_Var5._M_p = (char)iVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar2) {
    local_70.field_2._8_8_ = local_90.field_2._8_8_;
    local_70._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70._M_dataplus._M_p = local_90._M_dataplus._M_p;
  }
  local_70._M_string_length = local_90._M_string_length;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar2;
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    lVar4 = plVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::a_type(t_type* type) {
  string prefix;

  if (is_vowel(type_name(type)[0]))
    prefix = "an";
  else
    prefix = "a";

  return prefix + capitalize(type_name(type));
}